

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_diag.c
# Opt level: O3

rt_function_error_t exec_matrix_diag_generic(rt_function_t *f)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  
  puVar1 = (undefined8 *)f->local_context;
  iVar3 = *(int *)(puVar1 + 2);
  if (0 < iVar3) {
    iVar4 = *(int *)((long)puVar1 + 0x2c);
    iVar2 = 0;
    do {
      if (0 < iVar4) {
        iVar3 = 0;
        do {
          if (iVar3 == iVar2 % iVar4) {
            uVar6 = (*(code *)puVar1[1])(*puVar1,iVar2);
            uVar5 = puVar1[3];
            iVar4 = *(int *)((long)puVar1 + 0x2c);
          }
          else {
            uVar5 = puVar1[3];
            uVar6 = 0;
          }
          (*(code *)puVar1[4])(uVar6,uVar5,iVar4 * iVar2 + iVar3);
          iVar3 = iVar3 + 1;
          iVar4 = *(int *)((long)puVar1 + 0x2c);
        } while (iVar3 < iVar4);
        iVar3 = *(int *)(puVar1 + 2);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < iVar3);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_matrix_diag_generic(rt_function_t *f) {
  matrix_diag_local_context_t *context =
      (matrix_diag_local_context_t *)(f->local_context);

  int i, j;
  for (i = 0; i < context->input_size; i++) {
    for (j = 0; j < context->last_ndim; j++) {
      if (i % context->last_ndim == j) {
        float x = context->get_input(context->input, i);
        context->set_output(context->output, i * context->last_ndim + j, x);
      } else {
        context->set_output(context->output, i * context->last_ndim + j, 0.);
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}